

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O2

bool __thiscall llvm::DWARFUnitIndex::parse(DWARFUnitIndex *this,DataExtractor IndexData)

{
  bool bVar1;
  
  bVar1 = parseImpl(this,IndexData);
  if (!bVar1) {
    (this->Header).NumBuckets = 0;
    std::__uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>::
    reset((__uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_> *
          )&this->ColumnKinds,(pointer)0x0);
    std::
    __uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
    ::reset((__uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
             *)&this->Rows,(pointer)0x0);
  }
  return bVar1;
}

Assistant:

bool DWARFUnitIndex::parse(DataExtractor IndexData) {
  bool b = parseImpl(IndexData);
  if (!b) {
    // Make sure we don't try to dump anything
    Header.NumBuckets = 0;
    // Release any partially initialized data.
    ColumnKinds.reset();
    Rows.reset();
  }
  return b;
}